

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

PatternExpression * PatternExpression::restoreExpression(Element *el,Translate *trans)

{
  bool bVar1;
  string *__lhs;
  string *nm;
  PatternExpression *res;
  Translate *trans_local;
  Element *el_local;
  
  __lhs = Element::getName_abi_cxx11_(el);
  bVar1 = std::operator==(__lhs,"tokenfield");
  if (bVar1) {
    nm = (string *)operator_new(0x30);
    TokenField::TokenField((TokenField *)nm);
  }
  else {
    bVar1 = std::operator==(__lhs,"contextfield");
    if (bVar1) {
      nm = (string *)operator_new(0x28);
      ContextField::ContextField((ContextField *)nm);
    }
    else {
      bVar1 = std::operator==(__lhs,"intb");
      if (bVar1) {
        nm = (string *)operator_new(0x18);
        ConstantValue::ConstantValue((ConstantValue *)nm);
      }
      else {
        bVar1 = std::operator==(__lhs,"operand_exp");
        if (bVar1) {
          nm = (string *)operator_new(0x18);
          OperandValue::OperandValue((OperandValue *)nm);
        }
        else {
          bVar1 = std::operator==(__lhs,"start_exp");
          if (bVar1) {
            nm = (string *)operator_new(0x10);
            StartInstructionValue::StartInstructionValue((StartInstructionValue *)nm);
          }
          else {
            bVar1 = std::operator==(__lhs,"end_exp");
            if (bVar1) {
              nm = (string *)operator_new(0x10);
              EndInstructionValue::EndInstructionValue((EndInstructionValue *)nm);
            }
            else {
              bVar1 = std::operator==(__lhs,"plus_exp");
              if (bVar1) {
                nm = (string *)operator_new(0x20);
                PlusExpression::PlusExpression((PlusExpression *)nm);
              }
              else {
                bVar1 = std::operator==(__lhs,"sub_exp");
                if (bVar1) {
                  nm = (string *)operator_new(0x20);
                  SubExpression::SubExpression((SubExpression *)nm);
                }
                else {
                  bVar1 = std::operator==(__lhs,"mult_exp");
                  if (bVar1) {
                    nm = (string *)operator_new(0x20);
                    MultExpression::MultExpression((MultExpression *)nm);
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"lshift_exp");
                    if (bVar1) {
                      nm = (string *)operator_new(0x20);
                      LeftShiftExpression::LeftShiftExpression((LeftShiftExpression *)nm);
                    }
                    else {
                      bVar1 = std::operator==(__lhs,"rshift_exp");
                      if (bVar1) {
                        nm = (string *)operator_new(0x20);
                        RightShiftExpression::RightShiftExpression((RightShiftExpression *)nm);
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"and_exp");
                        if (bVar1) {
                          nm = (string *)operator_new(0x20);
                          AndExpression::AndExpression((AndExpression *)nm);
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"or_exp");
                          if (bVar1) {
                            nm = (string *)operator_new(0x20);
                            OrExpression::OrExpression((OrExpression *)nm);
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"xor_exp");
                            if (bVar1) {
                              nm = (string *)operator_new(0x20);
                              XorExpression::XorExpression((XorExpression *)nm);
                            }
                            else {
                              bVar1 = std::operator==(__lhs,"div_exp");
                              if (bVar1) {
                                nm = (string *)operator_new(0x20);
                                DivExpression::DivExpression((DivExpression *)nm);
                              }
                              else {
                                bVar1 = std::operator==(__lhs,"minus_exp");
                                if (bVar1) {
                                  nm = (string *)operator_new(0x18);
                                  MinusExpression::MinusExpression((MinusExpression *)nm);
                                }
                                else {
                                  bVar1 = std::operator==(__lhs,"not_exp");
                                  if (!bVar1) {
                                    return (PatternExpression *)0x0;
                                  }
                                  nm = (string *)operator_new(0x18);
                                  NotExpression::NotExpression((NotExpression *)nm);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (**(code **)(*(long *)nm + 0x40))(nm,el,trans);
  return (PatternExpression *)nm;
}

Assistant:

PatternExpression *PatternExpression::restoreExpression(const Element *el,Translate *trans)

{
  PatternExpression *res;
  const string &nm(el->getName());

  if (nm == "tokenfield")
    res = new TokenField();
  else if (nm == "contextfield")
    res = new ContextField();
  else if (nm == "intb")
    res = new ConstantValue();
  else if (nm == "operand_exp")
    res = new OperandValue();
  else if (nm == "start_exp")
    res = new StartInstructionValue();
  else if (nm == "end_exp")
    res = new EndInstructionValue();
  else if (nm == "plus_exp")
    res = new PlusExpression();
  else if (nm == "sub_exp")
    res = new SubExpression();
  else if (nm == "mult_exp")
    res = new MultExpression();
  else if (nm == "lshift_exp")
    res = new LeftShiftExpression();
  else if (nm == "rshift_exp")
    res = new RightShiftExpression();
  else if (nm == "and_exp")
    res = new AndExpression();
  else if (nm == "or_exp")
    res = new OrExpression();
  else if (nm == "xor_exp")
    res = new XorExpression();
  else if (nm == "div_exp")
    res = new DivExpression();
  else if (nm == "minus_exp")
    res = new MinusExpression();
  else if (nm == "not_exp")
    res = new NotExpression();
  else
    return (PatternExpression *)0;

  res->restoreXml(el,trans);
  return res;
}